

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall
CTcTokFileDesc::CTcTokFileDesc
          (CTcTokFileDesc *this,char *fname,size_t fname_len,int index,CTcTokFileDesc *orig_desc,
          char *orig_fname,size_t orig_fname_len)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  
  this->src_pages_ = (CTcTokSrcPage **)0x0;
  this->src_pages_alo_ = 0;
  this->orig_ = orig_desc;
  this->next_ = (CTcTokFileDesc *)0x0;
  this->index_ = index;
  pcVar1 = lib_copy_str(fname,fname_len);
  this->fname_ = pcVar1;
  pcVar1 = lib_copy_str(orig_fname,orig_fname_len);
  this->orig_fname_ = pcVar1;
  pcVar1 = os_get_root_name(this->fname_);
  sVar2 = get_quoted_len(this->fname_,L'\"');
  pcVar3 = (char *)malloc(sVar2 + 3);
  this->dquoted_fname_ = pcVar3;
  sVar2 = get_quoted_len(this->fname_,L'\'');
  pcVar3 = (char *)malloc(sVar2 + 3);
  this->squoted_fname_ = pcVar3;
  sVar2 = get_quoted_len(pcVar1,L'\"');
  pcVar3 = (char *)malloc(sVar2 + 3);
  this->dquoted_rootname_ = pcVar3;
  sVar2 = get_quoted_len(pcVar1,L'\'');
  pcVar3 = (char *)malloc(sVar2 + 3);
  this->squoted_rootname_ = pcVar3;
  build_quoted_str(this->dquoted_fname_,this->fname_,L'\"');
  build_quoted_str(this->squoted_fname_,this->fname_,L'\'');
  build_quoted_str(this->dquoted_rootname_,pcVar1,L'\"');
  build_quoted_str(this->squoted_rootname_,pcVar1,L'\'');
  return;
}

Assistant:

CTcTokFileDesc::CTcTokFileDesc(const char *fname, size_t fname_len,
                               int index, CTcTokFileDesc *orig_desc,
                               const char *orig_fname, size_t orig_fname_len)
{
    const char *rootname;

    /* no source pages are allocated yet */
    src_pages_ = 0;
    src_pages_alo_ = 0;

    /* remember the first instance of this filename in the list */
    orig_ = orig_desc;

    /* there's nothing else in our chain yet */
    next_ = 0;

    /* remember my index in the master list */
    index_ = index;

    /* if there's a filename, save a copy of the name */
    fname_ = lib_copy_str(fname, fname_len);

    /* if there's an original filename save it as well */
    orig_fname_ = lib_copy_str(orig_fname, orig_fname_len);

    /* 
     *   get the root filename, since we need to build a quoted version of
     *   that as well as of the basic filename 
     */
    rootname = os_get_root_name(fname_);

    /* 
     *   Allocate space for the quoted versions of the filename - make room
     *   for the filename plus the quotes (one on each end) and a null
     *   terminator byte.
     */
    dquoted_fname_ = (char *)t3malloc(get_quoted_len(fname_, '"') + 3);
    squoted_fname_ = (char *)t3malloc(get_quoted_len(fname_, '\'') + 3);
    dquoted_rootname_ = (char *)t3malloc(get_quoted_len(rootname, '"') + 3);
    squoted_rootname_ = (char *)t3malloc(get_quoted_len(rootname, '\'') + 3);

    /* build the quoted version of the name */
    build_quoted_str(dquoted_fname_, fname_, '"');
    build_quoted_str(squoted_fname_, fname_, '\'');
    build_quoted_str(dquoted_rootname_, rootname, '"');
    build_quoted_str(squoted_rootname_, rootname, '\'');
}